

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reading.c
# Opt level: O0

int read_all_routes(FILE *fp,route_t **records)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int local_40;
  int i;
  int field_count;
  char **field_names;
  int record_count;
  int lines_count;
  char **record_values;
  route_t **records_local;
  FILE *fp_local;
  
  _record_count = (char **)0x0;
  record_values = (char **)records;
  records_local = (route_t **)fp;
  iVar1 = count_lines(fp);
  field_names._4_4_ = iVar1 + -1;
  field_names._0_4_ = 0;
  _i = (char **)0x0;
  iVar1 = read_header((FILE *)records_local,(char ***)&i);
  if (iVar1 < 0) {
    free_cstr_arr(_i,(long)iVar1);
    fp_local._4_4_ = -1;
  }
  else if (field_names._4_4_ < 1) {
    free_cstr_arr(_i,(long)iVar1);
    free(_record_count);
    fp_local._4_4_ = 0;
    if (field_names._4_4_ < 0) {
      fp_local._4_4_ = -1;
    }
  }
  else {
    pcVar3 = (char *)malloc((long)field_names._4_4_ * 0x2d8);
    *record_values = pcVar3;
    if (*record_values == (char *)0x0) {
      free_cstr_arr(_i,(long)iVar1);
      free(_record_count);
      fp_local._4_4_ = -1;
    }
    else {
      for (local_40 = 0; local_40 < field_names._4_4_; local_40 = local_40 + 1) {
        iVar2 = read_record((FILE *)records_local,iVar1,(char ***)&record_count);
        if (0 < iVar2) {
          read_route((route_t *)(*record_values + (long)local_40 * 0x2d8),iVar1,_i,_record_count);
          field_names._0_4_ = (int)field_names + 1;
        }
        free_cstr_arr(_record_count,(long)iVar1);
      }
      if ((int)field_names == 0) {
        pcVar3 = (char *)realloc(*record_values,0);
        *record_values = pcVar3;
      }
      free_cstr_arr(_i,(long)iVar1);
      fp_local._4_4_ = (int)field_names;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int read_all_routes(FILE *fp, route_t **records) {
    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    *records = malloc(lines_count * sizeof(**records));
    if (*records == NULL) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return -1;
    }

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_route(&(*records)[i], field_count, (const char **)field_names, (const char **)record_values);
            // free_cstr_arr(record_values, field_count);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    if (record_count == 0)
        *records = realloc(*records, record_count * sizeof(**records));

    free_cstr_arr(field_names, field_count);
    return record_count;
}